

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsVersion.cpp
# Opt level: O0

string * os_info_abi_cxx11_(void)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int ret;
  utsname details;
  string *osInfo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined7 in_stack_fffffffffffffe58;
  char in_stack_fffffffffffffe5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  utsname local_18f;
  undefined1 local_9;
  
  local_9 = 0;
  this = in_RDI;
  std::__cxx11::string::string(in_stack_fffffffffffffe60);
  memset(&local_18f,0,0x186);
  iVar1 = uname(&local_18f);
  if (iVar1 == 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_fffffffffffffe60,
               (char *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5f);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5f);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_fffffffffffffe60,
               (char *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5f);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5f);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_fffffffffffffe60,
               (char *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this,(char *)in_RDI);
  }
  return (string *)this;
}

Assistant:

std::string os_info()
{
    std::string osInfo;
    utsname details = {};

    const int ret = uname(&details);

    if (ret == 0) {
        osInfo.append(details.sysname);
        osInfo.push_back(' ');
        osInfo.push_back(' ');
        osInfo.append(details.release);
        osInfo.push_back(' ');
        osInfo.push_back(' ');
        osInfo.append(details.version);
    } else {
        osInfo = "POSIX";
    }
    return osInfo;
}